

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaParser::ColladaParser(ColladaParser *this,IOSystem *pIOHandler,string *pFile)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ColladaParser *this_00;
  IOStream *_stream;
  undefined4 extraout_var;
  CIrrXML_IOStreamReader *this_01;
  IrrXMLReader *pIVar7;
  runtime_error *prVar8;
  long *plVar9;
  size_type *psVar10;
  ZipArchiveIOSystem *zip_archive;
  string dae_filename;
  string extension;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  string local_110 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_118 = &(this->mFileName).field_2;
  (this->mFileName)._M_dataplus._M_p = (pointer)local_118;
  pcVar3 = (pFile->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + pFile->_M_string_length);
  p_Var1 = &(this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->mReader = (IrrXMLReader *)0x0;
  *(undefined8 *)&(this->mDataLibrary)._M_t._M_impl = 0;
  (this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mAccessorLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mMeshLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mNodeLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mImageLibrary)._M_t._M_impl = 0;
  (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mEffectLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mMaterialLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mLightLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mCameraLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mControllerLibrary)._M_t._M_impl = 0;
  (this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->mRootNode = (Node *)0x0;
  (this->mAnims).mName._M_dataplus._M_p = (pointer)0x0;
  (this->mAnims).mName._M_string_length = 0;
  (this->mAnims).mName.field_2._M_allocated_capacity = 0;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mAnimationClipLibrary).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnimationClipLibrary).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnimationClipLibrary).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((long)&(this->mAnims).mName.field_2 + 8) = 0;
  (this->mAnims).mName._M_dataplus._M_p = (pointer)&(this->mAnims).mName.field_2;
  (this->mAnims).mName.field_2._M_local_buf[0] = '\0';
  (this->mAnims).mChannels.
  super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnims).mChannels.
  super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnims).mChannels.
  super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAnims).mSubAnims.
  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnims).mSubAnims.
  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnims).mSubAnims.
  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mUnitSize = 1.0;
  this->mUpDirection = UP_Y;
  p_Var1 = &(this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mFormat = FV_1_5_n;
  if (pIOHandler == (IOSystem *)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_110[0]._M_dataplus._M_p = (pointer)&local_110[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"IOSystem is NULL.","");
    std::runtime_error::runtime_error(prVar8,(string *)local_110);
    *(undefined ***)prVar8 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  BaseImporter::GetExtension(local_110,pFile);
  iVar5 = std::__cxx11::string::compare((char *)local_110);
  if (iVar5 == 0) {
    this_00 = (ColladaParser *)0x0;
  }
  else {
    this_00 = (ColladaParser *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    ZipArchiveIOSystem::ZipArchiveIOSystem((ZipArchiveIOSystem *)this_00,pIOHandler,pFile,"r");
    bVar4 = ZipArchiveIOSystem::isOpen((ZipArchiveIOSystem *)this_00);
    if (bVar4) {
      ReadZaeManifest_abi_cxx11_(&local_158,this_00,zip_archive);
      if (local_158._M_string_length == 0) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Invalid ZAE","");
        ThrowException(this,&local_138);
      }
      _stream = (IOStream *)
                (**(code **)((this_00->mFileName)._M_dataplus._M_p + 0x20))
                          (this_00,local_158._M_dataplus._M_p,"rb");
      if (_stream == (IOStream *)0x0) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Invalid ZAE manifest: \'","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_158._M_dataplus._M_p,
                   local_158._M_dataplus._M_p + local_158._M_string_length);
        std::operator+(&local_50,&local_70,&local_90);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\' is missing","");
        std::operator+(&local_138,&local_50,&local_b0);
        ThrowException(this,&local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0041da51;
    }
  }
  paVar2 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"rb","");
  iVar6 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,local_158._M_dataplus._M_p);
  _stream = (IOStream *)CONCAT44(extraout_var,iVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (_stream == (IOStream *)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_138,"Failed to open file \'",pFile);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_138);
    local_158._M_dataplus._M_p = (pointer)*plVar9;
    psVar10 = (size_type *)(plVar9 + 2);
    if ((size_type *)local_158._M_dataplus._M_p == psVar10) {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158.field_2._8_8_ = plVar9[3];
      local_158._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar10;
    }
    local_158._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::runtime_error::runtime_error(prVar8,(string *)&local_158);
    *(undefined ***)prVar8 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0041da51:
  this_01 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_01,_stream);
  pIVar7 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_01);
  this->mReader = pIVar7;
  if (pIVar7 != (IrrXMLReader *)0x0) {
    ReadContents(this);
    if (iVar5 != 0) {
      bVar4 = ZipArchiveIOSystem::isOpen((ZipArchiveIOSystem *)this_00);
      if (bVar4) {
        ReadEmbeddedTextures(this,(ZipArchiveIOSystem *)this_00);
      }
    }
    (*(this_01->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110[0]._M_dataplus._M_p != &local_110[0].field_2) {
      operator_delete(local_110[0]._M_dataplus._M_p,local_110[0].field_2._M_allocated_capacity + 1);
    }
    if (this_00 != (ColladaParser *)0x0) {
      (**(code **)((this_00->mFileName)._M_dataplus._M_p + 8))(this_00);
    }
    (*_stream->_vptr_IOStream[1])(_stream);
    return;
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"Unable to read file, malformed XML","");
  ThrowException(this,&local_158);
}

Assistant:

ColladaParser::ColladaParser(IOSystem* pIOHandler, const std::string& pFile)
    : mFileName(pFile)
    , mReader(nullptr)
    , mDataLibrary()
    , mAccessorLibrary()
    , mMeshLibrary()
    , mNodeLibrary()
    , mImageLibrary()
    , mEffectLibrary()
    , mMaterialLibrary()
    , mLightLibrary()
    , mCameraLibrary()
    , mControllerLibrary()
    , mRootNode(nullptr)
    , mAnims()
    , mUnitSize(1.0f)
    , mUpDirection(UP_Y)
    , mFormat(FV_1_5_n)    // We assume the newest file format by default
{
    // validate io-handler instance
    if (nullptr == pIOHandler) {
        throw DeadlyImportError("IOSystem is NULL.");
    }

    std::unique_ptr<IOStream> daefile;
    std::unique_ptr<ZipArchiveIOSystem> zip_archive;

    // Determine type
    std::string extension = BaseImporter::GetExtension(pFile);
    if (extension != "dae") {
        zip_archive.reset(new ZipArchiveIOSystem(pIOHandler, pFile));
    }

    if (zip_archive && zip_archive->isOpen()) {
        std::string dae_filename = ReadZaeManifest(*zip_archive);

        if (dae_filename.empty()) {
            ThrowException(std::string("Invalid ZAE"));
        }

        daefile.reset(zip_archive->Open(dae_filename.c_str()));
        if (daefile == nullptr) {
            ThrowException(std::string("Invalid ZAE manifest: '") + std::string(dae_filename) + std::string("' is missing"));
        }
    }
    else {
        // attempt to open the file directly
        daefile.reset(pIOHandler->Open(pFile));
        if (daefile.get() == nullptr) {
            throw DeadlyImportError("Failed to open file '" + pFile + "'.");
        }
    }

    // generate a XML reader for it
    std::unique_ptr<CIrrXML_IOStreamReader> mIOWrapper(new CIrrXML_IOStreamReader(daefile.get()));
    mReader = irr::io::createIrrXMLReader(mIOWrapper.get());
    if (!mReader) {
        ThrowException("Unable to read file, malformed XML");
    }

    // start reading
    ReadContents();

    // read embedded textures
    if (zip_archive && zip_archive->isOpen()) {
        ReadEmbeddedTextures(*zip_archive);
    }
}